

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool check_more_than_two_unique_values<float,unsigned_long>
               (size_t nrows,size_t col,unsigned_long *Xc_indptr,unsigned_long *Xc_ind,float *Xc,
               MissingAction missing_action)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  long in_R8;
  unsigned_long ix;
  float x0;
  bool has_zeros;
  ulong local_48;
  float local_3c;
  bool local_1;
  
  if (in_RDI < 2) {
    local_1 = false;
  }
  else if (*(long *)(in_RDX + 8 + in_RSI * 8) == *(long *)(in_RDX + in_RSI * 8)) {
    local_1 = false;
  }
  else {
    bVar2 = (ulong)(*(long *)(in_RDX + 8 + in_RSI * 8) - *(long *)(in_RDX + in_RSI * 8)) < in_RDI;
    if ((((bVar2) &&
         (uVar3 = std::isnan((double)(ulong)*(uint *)(in_R8 + *(long *)(in_RDX + in_RSI * 8) * 4)),
         (uVar3 & 1) == 0)) &&
        (uVar3 = std::isinf((double)(ulong)*(uint *)(in_R8 + *(long *)(in_RDX + in_RSI * 8) * 4)),
        (uVar3 & 1) == 0)) &&
       ((fVar1 = *(float *)(in_R8 + *(long *)(in_RDX + in_RSI * 8) * 4), fVar1 != 0.0 ||
        (NAN(fVar1))))) {
      local_1 = true;
    }
    else {
      local_3c = 0.0;
      for (local_48 = *(ulong *)(in_RDX + in_RSI * 8);
          local_48 < *(ulong *)(in_RDX + 8 + in_RSI * 8); local_48 = local_48 + 1) {
        uVar3 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
        if ((((uVar3 & 1) == 0) &&
            (uVar3 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_48 * 4)), (uVar3 & 1) == 0))
           && ((!bVar2 || ((fVar1 = *(float *)(in_R8 + local_48 * 4), fVar1 != 0.0 || (NAN(fVar1))))
               ))) {
          if (bVar2) {
            return true;
          }
          fVar1 = *(float *)(in_R8 + local_48 * 4);
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            bVar2 = true;
          }
          local_3c = *(float *)(in_R8 + local_48 * 4);
          break;
        }
      }
      for (local_48 = *(ulong *)(in_RDX + in_RSI * 8);
          local_48 < *(ulong *)(in_RDX + 8 + in_RSI * 8); local_48 = local_48 + 1) {
        uVar3 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
        if ((((uVar3 & 1) == 0) &&
            (uVar3 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_48 * 4)), (uVar3 & 1) == 0))
           && ((!bVar2 || ((fVar1 = *(float *)(in_R8 + local_48 * 4), fVar1 != 0.0 || (NAN(fVar1))))
               ))) {
          fVar1 = *(float *)(in_R8 + local_48 * 4);
          if ((fVar1 != local_3c) || (NAN(fVar1) || NAN(local_3c))) {
            return true;
          }
        }
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool check_more_than_two_unique_values(size_t nrows, size_t col,
                                       sparse_ix *restrict Xc_indptr, sparse_ix *restrict Xc_ind, real_t *restrict Xc,
                                       MissingAction missing_action)
{
    if (nrows <= 1) return false;
    if (Xc_indptr[col+1] == Xc_indptr[col]) return false;
    bool has_zeros = nrows > (size_t)(Xc_indptr[col+1] - Xc_indptr[col]);
    if (has_zeros && !is_na_or_inf(Xc[Xc_indptr[col]]) && Xc[Xc_indptr[col]] != 0) return true;

    real_t x0 = 0;
    sparse_ix ix;
    for (ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
    {
        if (!is_na_or_inf(Xc[ix]))
        {
            if (has_zeros && Xc[ix] == 0) continue;
            if (has_zeros) return true;
            else if (Xc[ix] == 0) has_zeros = true;
            x0 = Xc[ix];
            ix++;
            break;
        }
    }

    for (ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
    {
        if (!is_na_or_inf(Xc[ix]))
        {
            if (has_zeros && Xc[ix] == 0) continue;
            if (Xc[ix] != x0) return true;
        }
    }

    return false;
}